

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_update_teleport_tree_connections.hpp
# Opt level: O0

void __thiscall
PatchUpdateTeleportTreeConnections::inject_code
          (PatchUpdateTeleportTreeConnections *this,ROM *rom,World *world)

{
  bool bVar1;
  uint16_t uVar2;
  vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
  *this_00;
  Flag *pFVar3;
  size_type sVar4;
  LandstalkerException *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  WorldTeleportTree *local_78;
  WorldTeleportTree *tree_2;
  WorldTeleportTree *tree_1;
  pair<WorldTeleportTree_*,_WorldTeleportTree_*> *pair;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
  *__range1;
  RandomizerWorld *randomizer_world;
  ByteArray bytes;
  uint32_t TELEPORT_TREE_FLAGS_TABLE_ADDR;
  World *world_local;
  ROM *rom_local;
  PatchUpdateTeleportTreeConnections *this_local;
  
  bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x5102;
  ByteArray::ByteArray((ByteArray *)&randomizer_world);
  this_00 = RandomizerWorld::teleport_tree_pairs((RandomizerWorld *)world);
  __end1 = std::
           vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
           ::begin(this_00);
  pair = (pair<WorldTeleportTree_*,_WorldTeleportTree_*> *)
         std::
         vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
         ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_*,_std::vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>_>
                      (&__end1,(__normal_iterator<const_std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_*,_std::vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>_>
                                *)&pair);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    tree_1 = (WorldTeleportTree *)
             __gnu_cxx::
             __normal_iterator<const_std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_*,_std::vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>_>
             ::operator*(&__end1);
    tree_2 = (WorldTeleportTree *)(tree_1->_name)._M_dataplus._M_p;
    local_78 = (WorldTeleportTree *)(tree_1->_name)._M_string_length;
    uVar2 = WorldTeleportTree::map_id(tree_2);
    ByteArray::add_word((ByteArray *)&randomizer_world,uVar2);
    pFVar3 = WorldTeleportTree::flag(local_78);
    ByteArray::add_byte((ByteArray *)&randomizer_world,(uint8_t)pFVar3->byte);
    pFVar3 = WorldTeleportTree::flag(local_78);
    ByteArray::add_byte((ByteArray *)&randomizer_world,pFVar3->bit);
    uVar2 = WorldTeleportTree::map_id(local_78);
    ByteArray::add_word((ByteArray *)&randomizer_world,uVar2);
    pFVar3 = WorldTeleportTree::flag(tree_2);
    ByteArray::add_byte((ByteArray *)&randomizer_world,(uint8_t)pFVar3->byte);
    pFVar3 = WorldTeleportTree::flag(tree_2);
    ByteArray::add_byte((ByteArray *)&randomizer_world,pFVar3->bit);
    __gnu_cxx::
    __normal_iterator<const_std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_*,_std::vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>_>
    ::operator++(&__end1);
  }
  ByteArray::add_word((ByteArray *)&randomizer_world,0xffff);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&randomizer_world);
  if (sVar4 != 0x2a) {
    local_aa = 1;
    this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "Teleport tree flags array has a different size from vanilla game.",&local_a9);
    LandstalkerException::LandstalkerException(this_01,&local_a8);
    local_aa = 0;
    __cxa_throw(this_01,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_c8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&randomizer_world);
  md::ROM::set_bytes(rom,0x5102,&local_c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c8);
  ByteArray::~ByteArray((ByteArray *)&randomizer_world);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        constexpr uint32_t TELEPORT_TREE_FLAGS_TABLE_ADDR = 0x5102;
        ByteArray bytes;

        RandomizerWorld& randomizer_world = reinterpret_cast<RandomizerWorld&>(world);
        for(const auto& pair : randomizer_world.teleport_tree_pairs())
        {
            WorldTeleportTree* tree_1 = pair.first;
            WorldTeleportTree* tree_2 = pair.second;

            bytes.add_word(tree_1->map_id());
            bytes.add_byte((uint8_t)tree_2->flag().byte);
            bytes.add_byte(tree_2->flag().bit);

            bytes.add_word(tree_2->map_id());
            bytes.add_byte((uint8_t)tree_1->flag().byte);
            bytes.add_byte(tree_1->flag().bit);
        }
        bytes.add_word(0xFFFF);

        if(bytes.size() != 0x2A)
            throw LandstalkerException("Teleport tree flags array has a different size from vanilla game.");
        rom.set_bytes(TELEPORT_TREE_FLAGS_TABLE_ADDR, bytes);
    }